

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::TexSubImage2DEmptyTexCase::createTexture(TexSubImage2DEmptyTexCase *this)

{
  ContextWrapper *this_00;
  float fVar1;
  float fVar2;
  deUint32 type;
  int i;
  uint uVar3;
  deUint32 dVar4;
  long lVar5;
  uint uVar6;
  int ndx;
  int iVar7;
  uint uVar8;
  int width;
  int height;
  int iVar9;
  float fVar10;
  deUint32 tex;
  int local_e4;
  ulong local_e0;
  Vec4 gMax;
  TextureFormat fmt;
  Vec4 gMin;
  PixelBufferAccess local_a8;
  float afStack_78 [4];
  Random rnd;
  TextureLevel data;
  
  fmt = (this->super_TextureSpecCase).m_texFormat;
  iVar9 = 1;
  if (((this->super_TextureSpecCase).m_flags & 1) != 0) {
    uVar8 = (this->super_TextureSpecCase).m_width;
    uVar3 = 0x20;
    uVar6 = 0x20;
    if (uVar8 != 0) {
      uVar6 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      uVar6 = uVar6 ^ 0x1f;
    }
    uVar8 = (this->super_TextureSpecCase).m_height;
    if (uVar8 != 0) {
      uVar3 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = uVar3 ^ 0x1f;
    }
    iVar9 = 0x1f - uVar3;
    if ((int)(0x1f - uVar3) < (int)(0x1f - uVar6)) {
      iVar9 = 0x1f - uVar6;
    }
    iVar9 = iVar9 + 1;
  }
  tex = 0;
  tcu::TextureLevel::TextureLevel(&data,&fmt);
  dVar4 = deStringHash((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                       m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar4);
  this_00 = &(this->super_TextureSpecCase).super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  if (0 < iVar9) {
    iVar7 = 0;
    do {
      width = (this->super_TextureSpecCase).m_width >> ((byte)iVar7 & 0x1f);
      if (width < 2) {
        width = 1;
      }
      height = (this->super_TextureSpecCase).m_height >> ((byte)iVar7 & 0x1f);
      if (height < 2) {
        height = 1;
      }
      sglr::ContextWrapper::glTexImage2D
                (this_00,0xde1,iVar7,this->m_format,width,height,0,this->m_format,this->m_dataType,
                 (void *)0x0);
      iVar7 = iVar7 + 1;
    } while (iVar9 != iVar7);
  }
  local_e4 = iVar9;
  if (0 < iVar9) {
    iVar9 = 0;
    do {
      uVar8 = (this->super_TextureSpecCase).m_height >> ((byte)iVar9 & 0x1f);
      local_a8.super_ConstPixelBufferAccess.m_format.order = R;
      local_a8.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
      local_a8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
      local_a8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
      iVar7 = (this->super_TextureSpecCase).m_width >> ((byte)iVar9 & 0x1f);
      if (iVar7 < 2) {
        iVar7 = 1;
      }
      lVar5 = 0;
      do {
        gMax.m_data[lVar5] = 1.0;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      if ((int)uVar8 < 2) {
        uVar8 = 1;
      }
      local_e0 = (ulong)uVar8;
      gMin.m_data[0] = 0.0;
      gMin.m_data[1] = 0.0;
      gMin.m_data[2] = 0.0;
      gMin.m_data[3] = 0.0;
      lVar5 = 0;
      do {
        fVar1 = (float)local_a8.super_ConstPixelBufferAccess.m_size.m_data[lVar5 + -2];
        fVar2 = gMax.m_data[lVar5];
        fVar10 = deRandom_getFloat(&rnd.m_rnd);
        gMin.m_data[lVar5] = (fVar2 - fVar1) * fVar10 + fVar1;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      local_a8.super_ConstPixelBufferAccess.m_format.order = R;
      local_a8.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
      local_a8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
      local_a8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
      lVar5 = 0;
      do {
        afStack_78[lVar5] = 1.0;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      gMax.m_data[0] = 0.0;
      gMax.m_data[1] = 0.0;
      gMax.m_data[2] = 0.0;
      gMax.m_data[3] = 0.0;
      lVar5 = 0;
      do {
        fVar1 = (float)local_a8.super_ConstPixelBufferAccess.m_size.m_data[lVar5 + -2];
        fVar2 = afStack_78[lVar5];
        fVar10 = deRandom_getFloat(&rnd.m_rnd);
        gMax.m_data[lVar5] = (fVar2 - fVar1) * fVar10 + fVar1;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      tcu::TextureLevel::setSize(&data,iVar7,(int)local_e0,1);
      tcu::TextureLevel::getAccess(&local_a8,&data);
      tcu::fillWithComponentGradients(&local_a8,&gMin,&gMax);
      dVar4 = this->m_format;
      type = this->m_dataType;
      tcu::TextureLevel::getAccess(&local_a8,&data);
      sglr::ContextWrapper::glTexSubImage2D
                (this_00,0xde1,iVar9,0,0,iVar7,(int)local_e0,dVar4,type,
                 local_a8.super_ConstPixelBufferAccess.m_data);
      iVar9 = iVar9 + 1;
    } while (iVar9 != local_e4);
  }
  tcu::TextureLevel::~TextureLevel(&data);
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		int					numLevels	= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32			tex			= 0;
		tcu::TextureLevel	data		(fmt);
		de::Random			rnd			(deStringHash(getName()));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		// First allocate storage for each level.
		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			glTexImage2D(GL_TEXTURE_2D, ndx, m_format, levelW, levelH, 0, m_format, m_dataType, DE_NULL);
		}

		// Specify pixel data to all levels using glTexSubImage2D()
		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			Vec4	gMin		= randomVector<4>(rnd);
			Vec4	gMax		= randomVector<4>(rnd);

			data.setSize(levelW, levelH);
			tcu::fillWithComponentGradients(data.getAccess(), gMin, gMax);

			glTexSubImage2D(GL_TEXTURE_2D, ndx, 0, 0, levelW, levelH, m_format, m_dataType, data.getAccess().getDataPtr());
		}
	}